

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces
          (ChElementBeamTaperedTimoshenko *this,ChVectorDynamic<> *Fi)

{
  ChQuaternion<double> *q;
  undefined8 uVar1;
  long start;
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> R;
  double node_multiplier;
  ChVectorDynamic<> Fi_local;
  ChVectorDynamic<> displ_dt;
  undefined1 local_228 [48];
  ChVectorDynamic<> displ;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_1e8;
  ChVector<double> mTgyro_i;
  ChVector<double> mFcent_i;
  ChMatrixDynamic<> FiR_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158 [3];
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_140 [2];
  ChMatrix33<double> Atoabs;
  ChMatrixRef local_e8;
  ChMatrix33<double> AtolocwelB;
  ChMatrix33<double> AtolocwelA;
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    __assert_fail("Fi.size() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x401,
                  "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  if ((this->tapered_section).
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    Atoabs.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ =
         0xc;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&displ,(int *)&Atoabs);
    (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
              (this,&displ);
    Atoabs.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_16_ =
         Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                   ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->Km,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&displ);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&Fi_local,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&Atoabs);
    Atoabs.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ =
         0xc;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&displ_dt,(int *)&Atoabs);
    GetField_dt(this,&displ_dt);
    Atoabs.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_16_ =
         Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                   ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->Rm,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&displ_dt);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&FiR_local,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&Atoabs);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&Fi_local,
               (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&FiR_local);
    Atoabs.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&DAT_bff0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&Fi_local,(Scalar *)&Atoabs);
    q = &this->q_element_abs_rot;
    ChMatrix33<double>::Set_A_quaternion(&Atoabs,q);
    GetNodeA((ChElementBeamTaperedTimoshenko *)local_228);
    local_1e8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = *(PointerType *)(local_228._0_8_ + 0x38);
    auVar4._0_8_ = (ulong)*(_func_int **)(local_228._0_8_ + 0x50) ^ 0x8000000000000000;
    auVar4._8_8_ = 0x8000000000000000;
    local_1e8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_rows.m_value = (long)-(double)*(_func_int **)(local_228._0_8_ + 0x40);
    local_1e8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_cols.m_value = (ulong)*(_func_int **)(local_228._0_8_ + 0x48) ^ 0x8000000000000000;
    local_1e8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .m_stride.m_outer.m_value = vmovlpd_avx(auVar4);
    ChQuaternion<double>::operator%
              ((ChQuaternion<double> *)&AtolocwelB,(ChQuaternion<double> *)&local_1e8,q);
    ChMatrix33<double>::Set_A_quaternion(&AtolocwelA,(ChQuaternion<double> *)&AtolocwelB);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8));
    GetNodeB((ChElementBeamTaperedTimoshenko *)&R);
    local_228._0_8_ =
         R.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_start[7];
    auVar5._0_8_ = (ulong)R.
                          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[10] ^ 0x8000000000000000;
    auVar5._8_8_ = 0x8000000000000000;
    local_228._8_8_ =
         (ulong)R.
                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_start[8] ^ 0x8000000000000000;
    local_228._16_8_ =
         (ulong)R.
                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_start[9] ^ 0x8000000000000000;
    local_228._24_8_ = vmovlpd_avx(auVar5);
    ChQuaternion<double>::operator%
              ((ChQuaternion<double> *)&local_1e8,(ChQuaternion<double> *)local_228,q);
    ChMatrix33<double>::Set_A_quaternion(&AtolocwelB,(ChQuaternion<double> *)&local_1e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &R.
                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    R.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    R.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    R.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)&Atoabs;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    emplace_back<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)&R
               ,(ChMatrix33<double> **)&local_1e8);
    local_1e8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)&AtolocwelA;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    emplace_back<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)&R
               ,(ChMatrix33<double> **)&local_1e8);
    local_1e8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)&Atoabs;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    emplace_back<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)&R
               ,(ChMatrix33<double> **)&local_1e8);
    local_1e8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)&AtolocwelB;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    emplace_back<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)&R
               ,(ChMatrix33<double> **)&local_1e8);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_1e8,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&Fi_local,(type *)0x0);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_e8,
               &Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(type *)0x0);
    ChMatrixCorotation::ComputeCK(&local_1e8,&R,4,&local_e8);
    Eigen::internal::handmade_aligned_free
              (local_1e8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data);
    start = 0;
    lVar2 = 0;
    node_multiplier = (this->super_ChElementBeam).length * 0.5;
    mFcent_i.m_data[2] = 0.0;
    mTgyro_i.m_data[2] = 0.0;
    mFcent_i.m_data[0] = 0.0;
    mFcent_i.m_data[1] = 0.0;
    mTgyro_i.m_data[0] = 0.0;
    mTgyro_i.m_data[1] = 0.0;
    for (uVar3 = 0;
        uVar3 < (ulong)((long)(this->nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar3 = uVar3 + 1) {
      if (lVar2 == 0) {
        std::
        __shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr((__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        *)local_228,
                       &(((this->tapered_section).
                          super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->sectionA).
                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                      );
        uVar1 = local_228._0_8_;
        ChFrameMoving<double>::GetWvel_loc
                  ((ChVector<double> *)&local_1e8,
                   (ChFrameMoving<double> *)
                   &(((((this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->super_ChNodeFEAbase).field_0x18);
        (**(code **)(*(_func_int **)uVar1 + 0x80))(uVar1,&mFcent_i,&mTgyro_i,&local_1e8);
      }
      else {
        std::
        __shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr((__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        *)local_228,
                       &(((this->tapered_section).
                          super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->sectionB).
                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                      );
        uVar1 = local_228._0_8_;
        ChFrameMoving<double>::GetWvel_loc
                  ((ChVector<double> *)&local_1e8,
                   (ChFrameMoving<double> *)
                   (*(long *)((long)&(((this->nodes).
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar2) + 0x18));
        (**(code **)(*(_func_int **)uVar1 + 0x80))(uVar1,&mFcent_i,&mTgyro_i,&local_1e8);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8));
      ChMatrix33<double>::operator*
                ((ChMatrix33<double> *)
                 (*(long *)((long)&(((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + lVar2) + 0x58),&mFcent_i);
      local_140[0] = local_158;
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)local_228,&node_multiplier,(StorageBaseType *)local_140);
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_1e8,Fi,start,3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)
                 &local_1e8,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)local_228);
      local_158[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&mTgyro_i;
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)local_228,&node_multiplier,(StorageBaseType *)local_158);
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_1e8,Fi,start + 3,
                 3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)
                 &local_1e8,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)local_228);
      lVar2 = lVar2 + 0x10;
      start = start + 6;
    }
    std::_Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>::
    ~_Vector_base(&R.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                 );
    Eigen::internal::handmade_aligned_free
              (FiR_local.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_data);
    Eigen::internal::handmade_aligned_free
              (displ_dt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    Eigen::internal::handmade_aligned_free
              (Fi_local.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    Eigen::internal::handmade_aligned_free
              (displ.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              );
    return;
  }
  __assert_fail("tapered_section",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                ,0x402,
                "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<> &)"
               );
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 12);
    assert(tapered_section);

    // set up vector of nodal displacements and small rotations (in local element system)
    ChVectorDynamic<> displ(12);
    this->GetStateBlock(displ);

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> Fi_local = this->Km * displ;

    // set up vector of nodal velocities (in local element system)
    ChVectorDynamic<> displ_dt(12);
    this->GetField_dt(displ_dt);

    // ChMatrixDynamic<> FiR_local = this->tapered_section->GetBeamRaleyghDamping() * this->Km * displ_dt;
    ChMatrixDynamic<> FiR_local = this->Rm * displ_dt;

    Fi_local += FiR_local;
    Fi_local *= -1.0;

    //
    // Corotate local internal loads
    //

    // Fi = C * Fi_local  with C block-diagonal rotations A  , for nodal forces in abs. frame
    ChMatrix33<> Atoabs(this->q_element_abs_rot);
    ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    std::vector<ChMatrix33<>*> R;
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelA);
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelB);
    ChMatrixCorotation::ComputeCK(Fi_local, R, 4, Fi);

    // Add also inertial quadratic terms: gyroscopic and centrifugal

    // CASE OF LUMPED MASS - fast
    double node_multiplier = 0.5 * length;
    ChVector<> mFcent_i;
    ChVector<> mTgyro_i;
    for (int i = 0; i < nodes.size(); ++i) {
        // int stride = i * 6;
        if (i == 0) {
            this->tapered_section->GetSectionA()->ComputeQuadraticTerms(mFcent_i, mTgyro_i, nodes[i]->GetWvel_loc());
        } else {  // i==1
            this->tapered_section->GetSectionB()->ComputeQuadraticTerms(mFcent_i, mTgyro_i, nodes[i]->GetWvel_loc());
        }
        ChQuaternion<> q_i(nodes[i]->GetRot());
        Fi.segment(i * 6, 3) -= node_multiplier * (nodes[i]->GetA() * mFcent_i).eigen();
        Fi.segment(3 + i * 6, 3) -= node_multiplier * mTgyro_i.eigen();
    }

#ifdef BEAM_VERBOSE
    GetLog() << "\nInternal forces (local): \n";
    for (int c = 0; c < 6; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n\nInternal forces (ABS) : \n";
    for (int c = 0; c < 6; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
#endif
}